

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DylibBundler.cpp
# Opt level: O0

void addDependency(string *path,string *filename)

{
  undefined1 uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  value_type *__x;
  string *in_RDI;
  int n_1;
  int deps_in_file_amount;
  bool in_deps_per_file;
  vector<Dependency,_std::allocator<Dependency>_> deps_in_file;
  int n;
  int dep_amount;
  bool in_deps;
  Dependency dep;
  string *in_stack_00001100;
  string *in_stack_00001108;
  Dependency *in_stack_00001110;
  Dependency *in_stack_fffffffffffffec8;
  undefined5 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  string local_108 [16];
  key_type *in_stack_ffffffffffffff08;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Dependency,_std::allocator<Dependency>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Dependency,_std::allocator<Dependency>_>_>_>_>
  *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  int iVar6;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  uint uVar7;
  vector<Dependency,_std::allocator<Dependency>_> local_d8;
  int iVar8;
  uint in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  string local_a8 [168];
  
  std::__cxx11::string::string(local_a8,in_RDI);
  Dependency::Dependency(in_stack_00001110,in_stack_00001108,in_stack_00001100);
  std::__cxx11::string::~string(local_a8);
  in_stack_ffffffffffffff48 = in_stack_ffffffffffffff48 & 0xffffff;
  sVar5 = std::vector<Dependency,_std::allocator<Dependency>_>::size(&deps);
  iVar3 = (int)sVar5;
  for (iVar8 = 0; iVar8 < iVar3; iVar8 = iVar8 + 1) {
    std::vector<Dependency,_std::allocator<Dependency>_>::operator[](&deps,(long)iVar8);
    in_stack_fffffffffffffee7 =
         Dependency::mergeIfSameAs
                   ((Dependency *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                    (Dependency *)CONCAT44(iVar3,iVar8));
    if ((bool)in_stack_fffffffffffffee7) {
      in_stack_ffffffffffffff48 = CONCAT13(1,(int3)in_stack_ffffffffffffff48);
    }
  }
  __x = (value_type *)
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Dependency,_std::allocator<Dependency>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Dependency,_std::allocator<Dependency>_>_>_>_>
        ::operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::vector<Dependency,_std::allocator<Dependency>_>::vector
            ((vector<Dependency,_std::allocator<Dependency>_> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             (vector<Dependency,_std::allocator<Dependency>_> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  uVar7 = 0;
  sVar5 = std::vector<Dependency,_std::allocator<Dependency>_>::size(&local_d8);
  iVar4 = (int)sVar5;
  for (iVar6 = 0; iVar6 < iVar4; iVar6 = iVar6 + 1) {
    std::vector<Dependency,_std::allocator<Dependency>_>::operator[](&local_d8,(long)iVar6);
    in_stack_fffffffffffffed7 =
         Dependency::mergeIfSameAs
                   ((Dependency *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                    (Dependency *)CONCAT44(iVar3,iVar8));
    if ((bool)in_stack_fffffffffffffed7) {
      uVar7 = 0x1000000;
    }
  }
  Dependency::getPrefix_abi_cxx11_(in_stack_fffffffffffffec8);
  uVar1 = Settings::isPrefixBundled(&in_stack_fffffffffffffec8->filename);
  bVar2 = uVar1 ^ 0xff;
  std::__cxx11::string::~string(local_108);
  if ((bVar2 & 1) == 0) {
    if ((in_stack_ffffffffffffff48 & 0x1000000) == 0) {
      std::vector<Dependency,_std::allocator<Dependency>_>::push_back
                ((vector<Dependency,_std::allocator<Dependency>_> *)
                 CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),__x);
    }
    if ((uVar7 & 0x1000000) == 0) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Dependency,_std::allocator<Dependency>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Dependency,_std::allocator<Dependency>_>_>_>_>
      ::operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      std::vector<Dependency,_std::allocator<Dependency>_>::push_back
                ((vector<Dependency,_std::allocator<Dependency>_> *)
                 CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),__x);
    }
  }
  std::vector<Dependency,_std::allocator<Dependency>_>::~vector
            ((vector<Dependency,_std::allocator<Dependency>_> *)
             CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
  Dependency::~Dependency
            ((Dependency *)
             CONCAT17(in_stack_fffffffffffffed7,
                      CONCAT16(uVar1,CONCAT15(bVar2,in_stack_fffffffffffffed0))));
  return;
}

Assistant:

void addDependency(const std::string& path, const std::string& filename)
{
    Dependency dep(path, filename);
    
    // we need to check if this library was already added to avoid duplicates
    bool in_deps = false;
    const int dep_amount = deps.size();
    for(int n=0; n<dep_amount; n++)
    {
        if(dep.mergeIfSameAs(deps[n])) in_deps = true;
    }
    
    // check if this library was already added to |deps_per_file[filename]| to avoid duplicates
    std::vector<Dependency> deps_in_file = deps_per_file[filename];
    bool in_deps_per_file = false;
    const int deps_in_file_amount = deps_in_file.size();
    for(int n=0; n<deps_in_file_amount; n++)
    {
        if(dep.mergeIfSameAs(deps_in_file[n])) in_deps_per_file = true;
    }

    if(!Settings::isPrefixBundled(dep.getPrefix())) return;
    
    if(!in_deps) deps.push_back(dep);
    if(!in_deps_per_file) deps_per_file[filename].push_back(dep);
}